

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  ushort uVar1;
  SSL *pSVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  tls_extension *ptVar6;
  _func_int_SSL_ptr_int_ptr_void_ptr *p_Var7;
  ssl_ctx_st *psVar8;
  CBS *pCVar9;
  uint desc;
  ushort *puVar10;
  long lVar11;
  uint8_t alert;
  uint16_t type;
  uint ext_index;
  CBS extensions;
  CBS extension;
  
  pSVar2 = hs->ssl;
  (hs->extensions).sent = 0;
  extensions.data = client_hello->extensions;
  extensions.len = client_hello->extensions_len;
  do {
    do {
      if (extensions.len == 0) {
        puVar10 = &kExtensions;
        lVar11 = 0;
        goto LAB_001343f2;
      }
      iVar5 = CBS_get_u16(&extensions,&type);
      if ((iVar5 == 0) || (iVar5 = CBS_get_u16_length_prefixed(&extensions,&extension), iVar5 == 0))
      {
        desc = 0x32;
        goto LAB_00134532;
      }
      ptVar6 = tls_extension_find(&ext_index,type);
    } while (ptVar6 == (tls_extension *)0x0);
    (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)ext_index & 0x1f);
    alert = '2';
    bVar3 = (*ptVar6->parse_clienthello)(hs,&alert,&extension);
  } while (bVar3);
  desc = (uint)alert;
  ERR_put_error(0x10,0,0x95,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0xfd2);
  ERR_add_error_dataf("extension %u",(ulong)type);
LAB_00134532:
  ssl_send_alert(pSVar2,2,desc);
  return false;
LAB_001343f2:
  if (lVar11 == 0x1c) goto LAB_00134472;
  if (((hs->extensions).sent >> ((uint)lVar11 & 0x1f) & 1) == 0) {
    uVar1 = *puVar10;
    if ((uVar1 == 0xff01) &&
       (bVar3 = ssl_client_cipher_list_contains_cipher(client_hello,0xff), bVar3)) {
      extension.data = "";
      extension.len = 1;
      (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)lVar11 & 0x1f);
      pCVar9 = &extension;
    }
    else {
      pCVar9 = (CBS *)0x0;
    }
    ext_index._0_1_ = 0x32;
    cVar4 = (**(code **)(puVar10 + 0xc))(hs,&ext_index,pCVar9);
    if (cVar4 == '\0') {
      ERR_put_error(0x10,0,0xa4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xfee);
      ERR_add_error_dataf("extension %u",(ulong)(uint)uVar1);
      desc = (uint)(byte)ext_index;
      goto LAB_00134532;
    }
  }
  lVar11 = lVar11 + 1;
  puVar10 = puVar10 + 0x14;
  goto LAB_001343f2;
LAB_00134472:
  pSVar2 = hs->ssl;
  extensions.data = (uint8_t *)CONCAT44(extensions.data._4_4_,0x70);
  psVar8 = (pSVar2->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  p_Var7 = psVar8->servername_callback;
  if (p_Var7 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
    psVar8 = (pSVar2->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    p_Var7 = psVar8->servername_callback;
    if (p_Var7 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) goto LAB_001344c0;
  }
  iVar5 = (*p_Var7)(pSVar2,(int *)&extensions,psVar8->servername_arg);
  if (iVar5 == 2) {
    ssl_send_alert(pSVar2,2,(int)extensions.data);
    ERR_put_error(0x10,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x1002);
    return false;
  }
  if (iVar5 != 3) {
    *(uint *)&hs->field_0x6c8 =
         *(uint *)&hs->field_0x6c8 & 0xfffffeff |
         (uint)((pSVar2->s3->hostname)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) << 8;
    return true;
  }
LAB_001344c0:
  hs->field_0x6c9 = hs->field_0x6c9 & 0xfe;
  return true;
}

Assistant:

bool ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,
                                  const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_clienthello_tlsext(hs, client_hello, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_clienthello_tlsext(hs)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_TLSEXT);
    return false;
  }

  return true;
}